

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall Compiler::visit(Compiler *this,FloatLit *node)

{
  pointer pvVar1;
  value_type_conflict1 local_41;
  iterator pvStack_40;
  value_type_conflict1 val;
  iterator __end1;
  iterator __begin1;
  array<unsigned_char,_8UL> *__range1;
  array<unsigned_char,_8UL> local_20;
  array<unsigned_char,_8UL> tmp;
  FloatLit *node_local;
  Compiler *this_local;
  
  tmp._M_elems = (_Type)node;
  memset(&local_20,0,8);
  pvVar1 = std::array<unsigned_char,_8UL>::data(&local_20);
  *(undefined8 *)pvVar1 = *(undefined8 *)((long)tmp._M_elems + 8);
  __range1._7_1_ = 10;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->m_buffer,(value_type_conflict1 *)((long)&__range1 + 7));
  __begin1 = local_20._M_elems;
  __end1 = std::array<unsigned_char,_8UL>::begin((array<unsigned_char,_8UL> *)__begin1);
  pvStack_40 = std::array<unsigned_char,_8UL>::end((array<unsigned_char,_8UL> *)__begin1);
  for (; __end1 != pvStack_40; __end1 = __end1 + 1) {
    local_41 = *__end1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->m_buffer,&local_41)
    ;
  }
  return;
}

Assistant:

void Compiler::visit(AST::FloatLit *node) {
    std::array<Bytecode, sizeof(double)> tmp = {};
    memcpy(tmp.data(), &node->m_value, sizeof(double));
    m_buffer.push_back(Opcode::DCONST);
    for (auto val : tmp) {
        m_buffer.push_back(val);
    }
}